

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O2

void __thiscall Break::gen(Break *this,int b,int a)

{
  ostream *this_00;
  stringstream ss;
  string local_1b0;
  stringstream local_190 [16];
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream(local_190);
  this_00 = std::operator<<(local_180,"goto L");
  std::ostream::operator<<
            (this_00,*(int *)&(((this->stmt).super___shared_ptr<Stmt,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_Node).field_0xc);
  std::__cxx11::stringbuf::str();
  Node::emit((Node *)this,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

void gen(int b, int a) override {
		std::stringstream ss;
		ss << "goto L" << stmt->after;
		emit(ss.str());
	}